

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O1

string * __thiscall
upb::generator::(anonymous_namespace)::MessageMiniTableRef_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,MessageDefPtr descriptor,
          Options *options)

{
  char *pcVar1;
  generator *pgVar2;
  string_view full_name;
  string_view full_name_00;
  string local_a0;
  size_t local_80;
  char *local_78;
  AlphaNum local_50;
  
  if (*(int *)&(descriptor.ptr_)->opts == 0) {
    pcVar1 = upb_MessageDef_FullName((upb_MessageDef *)this);
    pgVar2 = (generator *)strlen(pcVar1);
    full_name_00._M_str = (char *)options;
    full_name_00._M_len = (size_t)pcVar1;
    MiniTableMessageVarName_abi_cxx11_(&local_a0,pgVar2,full_name_00);
    local_50.piece_._M_len = local_a0._M_string_length;
    local_50.piece_._M_str = local_a0._M_dataplus._M_p;
    local_80 = 2;
    local_78 = "()";
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)__return_storage_ptr__,&local_50);
  }
  else {
    local_50.piece_._M_len = 1;
    local_50.piece_._M_str = "&";
    pcVar1 = upb_MessageDef_FullName((upb_MessageDef *)this);
    pgVar2 = (generator *)strlen(pcVar1);
    full_name._M_str = (char *)options;
    full_name._M_len = (size_t)pcVar1;
    MiniTableMessageVarName_abi_cxx11_(&local_a0,pgVar2,full_name);
    local_80 = local_a0._M_string_length;
    local_78 = local_a0._M_dataplus._M_p;
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)__return_storage_ptr__,&local_50);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string MessageMiniTableRef(upb::MessageDefPtr descriptor,
                                const Options& options) {
  if (options.bootstrap_stage == 0) {
    return absl::StrCat(MiniTableMessageVarName(descriptor.full_name()), "()");
  } else {
    return absl::StrCat("&", MiniTableMessageVarName(descriptor.full_name()));
  }
}